

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O1

JSValue js_typed_array_get_byteLength(JSContext *ctx,JSValue this_val,int is_dataview)

{
  JSObject *pJVar1;
  int64_t iVar2;
  JSValueUnion JVar3;
  JSValue JVar4;
  
  pJVar1 = get_typed_array(ctx,this_val,is_dataview);
  iVar2 = 6;
  if (pJVar1 == (JSObject *)0x0) {
    JVar3.float64 = 0.0;
  }
  else {
    if (((((pJVar1->u).typed_array)->buffer->u).array_buffer)->detached == '\0') {
      JVar3._4_4_ = 0;
      JVar3.int32 = ((pJVar1->u).typed_array)->length;
    }
    else {
      if (is_dataview != 0) {
        JVar3.float64 = 0.0;
        JS_ThrowTypeError(ctx,"ArrayBuffer is detached");
        goto LAB_0016e94d;
      }
      JVar3.float64 = 0.0;
    }
    iVar2 = 0;
  }
LAB_0016e94d:
  JVar4.tag = iVar2;
  JVar4.u.float64 = JVar3.float64;
  return JVar4;
}

Assistant:

static JSValue js_typed_array_get_byteLength(JSContext *ctx,
                                             JSValueConst this_val,
                                             int is_dataview)
{
    JSObject *p;
    JSTypedArray *ta;
    p = get_typed_array(ctx, this_val, is_dataview);
    if (!p)
        return JS_EXCEPTION;
    if (typed_array_is_detached(ctx, p)) {
        if (is_dataview) {
            return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        } else {
            return JS_NewInt32(ctx, 0);
        }
    }
    ta = p->u.typed_array;
    return JS_NewInt32(ctx, ta->length);
}